

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

void poly_lift(poly *out,poly *a)

{
  uint16_t uVar1;
  short sVar2;
  ushort uVar3;
  uint16_t uVar4;
  size_t i;
  long lVar5;
  uint i_1;
  uint16_t uVar6;
  int iVar7;
  uint uVar8;
  short sVar9;
  short sVar10;
  ulong uVar11;
  
  uVar6 = (a->field_0).v[2] + (a->field_0).v[0];
  (out->field_0).v[0] = uVar6;
  uVar1 = (a->field_0).v[1];
  (out->field_0).v[1] = uVar1;
  uVar4 = (a->field_0).v[2] - (a->field_0).v[0];
  (out->field_0).v[2] = uVar4;
  uVar11 = 0;
  sVar10 = 0;
  sVar9 = 0;
  do {
    sVar2 = *(short *)((long)&a->field_0 + uVar11 * 2 + 10);
    sVar10 = (sVar10 - *(short *)((long)&a->field_0 + uVar11 * 2 + 6)) + sVar2;
    sVar9 = (sVar9 - sVar2) + *(short *)((long)&a->field_0 + uVar11 * 2 + 8);
    uVar11 = uVar11 + 3;
  } while (uVar11 < 0x2b8);
  sVar10 = sVar10 - (a->field_0).v[699];
  sVar9 = sVar9 + (a->field_0).v[700];
  (out->field_0).v[0] = uVar6 + sVar10;
  (out->field_0).v[1] = uVar1 - (sVar10 + sVar9);
  (out->field_0).v[2] = uVar4 + sVar9;
  lVar5 = 3;
  do {
    (out->field_0).v[lVar5] =
         *(short *)((long)out + lVar5 * 2 + -6) -
         (*(short *)((long)a + lVar5 * 2 + -4) + *(short *)((long)a + lVar5 * 2 + -2) +
         (a->field_0).v[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2bd);
  uVar3 = (out->field_0).v[700];
  lVar5 = 0;
  do {
    iVar7 = (uint)(out->field_0).v[lVar5] - (uint)uVar3;
    uVar8 = iVar7 + ((uint)((short)iVar7 * 0x5555) >> 0x10) * -3;
    uVar8 = ((int)(short)uVar8 >> 1 & uVar8) - 1 & uVar8;
    (out->field_0).v[lVar5] = -(short)((uVar8 & 0xffff) >> 1) | (ushort)uVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2bd);
  uVar1 = (out->field_0).v[700];
  lVar5 = 0x578;
  do {
    *(short *)((long)&out->field_0 + lVar5) =
         *(short *)((long)out + lVar5 + -2) - *(short *)((long)&out->field_0 + lVar5);
    lVar5 = lVar5 + -2;
  } while (lVar5 != 0);
  (out->field_0).v[0] = uVar1 - (out->field_0).v[0];
  *(undefined4 *)((long)&out->field_0 + 0x57a) = 0;
  (out->field_0).v[0x2bf] = 0;
  return;
}

Assistant:

static void poly_lift(struct poly *out, const struct poly *a) {
  // We wish to calculate a/(𝑥-1) mod Φ(N) over GF(3), where Φ(N) is the
  // Nth cyclotomic polynomial, i.e. 1 + 𝑥 + … + 𝑥^700 (since N is prime).

  // 1/(𝑥-1) has a fairly basic structure that we can exploit to speed this up:
  //
  // R.<x> = PolynomialRing(GF(3)…)
  // inv = R.cyclotomic_polynomial(1).inverse_mod(R.cyclotomic_polynomial(n))
  // list(inv)[:15]
  //   [1, 0, 2, 1, 0, 2, 1, 0, 2, 1, 0, 2, 1, 0, 2]
  //
  // This three-element pattern of coefficients repeats for the whole
  // polynomial.
  //
  // Next define the overbar operator such that z̅ = z[0] +
  // reverse(z[1:]). (Index zero of a polynomial here is the coefficient
  // of the constant term. So index one is the coefficient of 𝑥 and so
  // on.)
  //
  // A less odd way to define this is to see that z̅ negates the indexes,
  // so z̅[0] = z[-0], z̅[1] = z[-1] and so on.
  //
  // The use of z̅ is that, when working mod (𝑥^701 - 1), vz[0] = <v,
  // z̅>, vz[1] = <v, 𝑥z̅>, …. (Where <a, b> is the inner product: the sum
  // of the point-wise products.) Although we calculated the inverse mod
  // Φ(N), we can work mod (𝑥^N - 1) and reduce mod Φ(N) at the end.
  // (That's because (𝑥^N - 1) is a multiple of Φ(N).)
  //
  // When working mod (𝑥^N - 1), multiplication by 𝑥 is a right-rotation
  // of the list of coefficients.
  //
  // Thus we can consider what the pattern of z̅, 𝑥z̅, 𝑥^2z̅, … looks like:
  //
  // def reverse(xs):
  //   suffix = list(xs[1:])
  //   suffix.reverse()
  //   return [xs[0]] + suffix
  //
  // def rotate(xs):
  //   return [xs[-1]] + xs[:-1]
  //
  // zoverbar = reverse(list(inv) + [0])
  // xzoverbar = rotate(reverse(list(inv) + [0]))
  // x2zoverbar = rotate(rotate(reverse(list(inv) + [0])))
  //
  // zoverbar[:15]
  //   [1, 0, 1, 2, 0, 1, 2, 0, 1, 2, 0, 1, 2, 0, 1]
  // xzoverbar[:15]
  //   [0, 1, 0, 1, 2, 0, 1, 2, 0, 1, 2, 0, 1, 2, 0]
  // x2zoverbar[:15]
  //   [2, 0, 1, 0, 1, 2, 0, 1, 2, 0, 1, 2, 0, 1, 2]
  //
  // (For a formula for z̅, see lemma two of appendix B.)
  //
  // After the first three elements have been taken care of, all then have
  // a repeating three-element cycle. The next value (𝑥^3z̅) involves
  // three rotations of the first pattern, thus the three-element cycle
  // lines up. However, the discontinuity in the first three elements
  // obviously moves to a different position. Consider the difference
  // between 𝑥^3z̅ and z̅:
  //
  // [x-y for (x,y) in zip(zoverbar, x3zoverbar)][:15]
  //    [0, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0]
  //
  // This pattern of differences is the same for all elements, although it
  // obviously moves right with the rotations.
  //
  // From this, we reach algorithm eight of appendix B.

  // Handle the first three elements of the inner products.
  out->v[0] = a->v[0] + a->v[2];
  out->v[1] = a->v[1];
  out->v[2] = -a->v[0] + a->v[2];

  // s0, s1, s2 are added into out->v[0], out->v[1], and out->v[2],
  // respectively. We do not compute s1 because it's just -(s0 + s1).
  uint16_t s0 = 0, s2 = 0;
  for (size_t i = 3; i < 699; i += 3) {
    s0 += -a->v[i] + a->v[i + 2];
    // s1 += a->v[i] - a->v[i + 1];
    s2 += a->v[i + 1] - a->v[i + 2];
  }

  // Handle the fact that the three-element pattern doesn't fill the
  // polynomial exactly (since 701 isn't a multiple of three).
  s0 -= a->v[699];
  // s1 += a->v[699] - a->v[700];
  s2 += a->v[700];

  // Note that s0 + s1 + s2 = 0.
  out->v[0] += s0;
  out->v[1] -= (s0 + s2);  // = s1
  out->v[2] += s2;

  // Calculate the remaining inner products by taking advantage of the
  // fact that the pattern repeats every three cycles and the pattern of
  // differences moves with the rotation.
  for (size_t i = 3; i < N; i++) {
    out->v[i] = (out->v[i - 3] - (a->v[i - 2] + a->v[i - 1] + a->v[i]));
  }

  // Reduce mod Φ(N) by subtracting a multiple of out[700] from every
  // element and convert to mod Q. (See above about adding twice as
  // subtraction.)
  const crypto_word_t v = out->v[700];
  for (unsigned i = 0; i < N; i++) {
    const uint16_t vi_mod3 = mod3(out->v[i] - v);
    // Map {0, 1, 2} to {0, 1, 0xffff}.
    out->v[i] = (~((vi_mod3 >> 1) - 1)) | vi_mod3;
  }

  poly_mul_x_minus_1(out);
  poly_normalize(out);
}